

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_lyb.c
# Opt level: O0

void lyd_lyb_ctx_free(lyd_ctx *lydctx)

{
  lyd_lyb_ctx *ctx;
  lyd_ctx *lydctx_local;
  
  if (lydctx != (lyd_ctx *)0x0) {
    lyd_ctx_free(lydctx);
    lylyb_ctx_free((lylyb_ctx *)lydctx->data_ctx);
    free(lydctx);
  }
  return;
}

Assistant:

void
lyd_lyb_ctx_free(struct lyd_ctx *lydctx)
{
    struct lyd_lyb_ctx *ctx = (struct lyd_lyb_ctx *)lydctx;

    if (!lydctx) {
        return;
    }

    lyd_ctx_free(lydctx);
    lylyb_ctx_free(ctx->lybctx);
    free(ctx);
}